

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

void __thiscall cppcms::http::context::async_complete_response(context *this)

{
  io_mode_type iVar1;
  response *prVar2;
  context *unaff_retaddr;
  ct_to_bool cb;
  context *in_stack_ffffffffffffff78;
  response *in_stack_ffffffffffffff90;
  ct_to_bool local_60;
  ct_to_bool *in_stack_ffffffffffffffc8;
  callback<void_(cppcms::http::context::completion_type)> *in_stack_ffffffffffffffd0;
  
  response((context *)0x3a2221);
  http::response::finalize(in_stack_ffffffffffffff90);
  prVar2 = response((context *)0x3a2233);
  iVar1 = http::response::io_mode(prVar2);
  if (iVar1 != asynchronous) {
    prVar2 = response((context *)0x3a224a);
    iVar1 = http::response::io_mode(prVar2);
    if (iVar1 != asynchronous_raw) {
      complete_response(unaff_retaddr);
      return;
    }
  }
  self(in_stack_ffffffffffffff78);
  std::__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3a228d);
  response((context *)0x3a229c);
  anon_unknown_3::ct_to_bool::ct_to_bool(&local_60,(ct_to_bool *)in_stack_ffffffffffffff78);
  booster::callback<void_(cppcms::http::context::completion_type)>::
  callback<cppcms::http::(anonymous_namespace)::ct_to_bool>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  cppcms::impl::cgi::connection::async_write_response
            ((connection *)this,
             (response *)
             cb.ctx.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,
             cb.ctx.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
             _7_1_,(ehandler *)cb._8_8_);
  booster::callback<void_(cppcms::http::context::completion_type)>::~callback
            ((callback<void_(cppcms::http::context::completion_type)> *)0x3a22ed);
  anon_unknown_3::ct_to_bool::~ct_to_bool((ct_to_bool *)0x3a22f7);
  anon_unknown_3::ct_to_bool::~ct_to_bool((ct_to_bool *)0x3a2301);
  return;
}

Assistant:

void context::async_complete_response()
{
	response().finalize();
	if(response().io_mode() == http::response::asynchronous || response().io_mode() == http::response::asynchronous_raw) {
		ct_to_bool cb = { &context::try_restart, self() };
		conn_->async_write_response(
			response(),
			true,
			cb);
		return;
	}
	complete_response();
}